

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

int Jf_ManComputeDelay(Jf_Man_t *p,int fEval)

{
  int iVar1;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar2;
  word *pwVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  
  p_00 = p->pGia;
  if (((fEval != 0) && (iVar5 = p_00->nObjs, 0 < iVar5)) &&
     (pGVar2 = p_00->pObjs, pGVar2 != (Gia_Obj_t *)0x0)) {
    lVar7 = 0;
    do {
      uVar8 = (uint)*(undefined8 *)(pGVar2 + lVar7);
      if (((-1 < (int)uVar8) && ((uVar8 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar8 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(pGVar2 + lVar7) >> 0x20) & 0x1fffffff))) {
        Gia_ObjId(p_00,pGVar2 + lVar7);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x458,"void Jf_ObjPropagateBuf(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) && (0 < p_00->pRefs[lVar7])) {
        if ((p->vCuts).nSize <= lVar7) goto LAB_007645d0;
        uVar8 = (p->vCuts).pArray[lVar7];
        pwVar3 = (p->pMem).pPages[(int)uVar8 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar9 = (long)(int)(uVar8 & (p->pMem).uPageMask);
        uVar8 = *(uint *)((long)pwVar3 + lVar9 * 8 + 4);
        if ((uVar8 & 0xf) == 0) {
          iVar5 = (p->vArr).nSize;
          iVar6 = 1;
        }
        else {
          uVar10 = 0;
          iVar6 = 0;
          do {
            uVar11 = *(uint *)((long)pwVar3 + uVar10 * 4 + lVar9 * 8 + 8);
            if ((int)uVar11 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar11 = uVar11 >> 1;
            iVar5 = (p->vArr).nSize;
            if (iVar5 <= (int)uVar11) goto LAB_007645d0;
            iVar1 = (p->vArr).pArray[uVar11];
            if (iVar6 <= iVar1) {
              iVar6 = iVar1;
            }
            uVar10 = uVar10 + 1;
          } while ((uVar8 & 0xf) != uVar10);
          iVar6 = iVar6 + 1;
        }
        if (iVar5 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vArr).pArray[lVar7] = iVar6;
        iVar5 = p_00->nObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar5);
  }
  lVar7 = (long)p_00->vCos->nSize;
  if (lVar7 < 1) {
    iVar5 = 0;
  }
  else {
    lVar9 = 0;
    iVar5 = 0;
    do {
      iVar6 = p_00->vCos->pArray[lVar9];
      if (((long)iVar6 < 0) || (p_00->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p_00->pObjs;
      pGVar2 = pGVar4 + iVar6 + -(ulong)((uint)*(undefined8 *)(pGVar4 + iVar6) & 0x1fffffff);
      if ((pGVar2 < pGVar4) || (pGVar4 + (uint)p_00->nObjs <= pGVar2)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar8 = (int)((long)pGVar2 - (long)pGVar4 >> 2) * -0x55555555;
      if (p_00->pRefs[(int)uVar8] < 1) {
        __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x517,"int Jf_ManComputeDelay(Jf_Man_t *, int)");
      }
      if (((int)uVar8 < 0) || ((p->vArr).nSize <= (int)uVar8)) {
LAB_007645d0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = (p->vArr).pArray[uVar8 & 0x7fffffff];
      if (iVar5 <= iVar6) {
        iVar5 = iVar6;
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  return iVar5;
}

Assistant:

int Jf_ManComputeDelay( Jf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachObj( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Jf_ObjPropagateBuf( p, pObj, 0 );
            else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vArr, i, Jf_CutArr(p, Jf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Jf_ObjArr(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}